

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> * __thiscall
dg::dda::MemorySSATransformation::findDefinitionsInPredecessors
          (MemorySSATransformation *this,RWBBlock *block,DefSite *ds)

{
  const_iterator __position;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  __first;
  iterator this_00;
  DefSite *in_RDX;
  RWBBlock *in_RSI;
  MemorySSATransformation *in_RDI;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> pdefs;
  RWBBlock *pred;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *defs;
  MemorySSATransformation *this_01;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffff98;
  DefSite *in_stack_ffffffffffffffa0;
  RWBBlock *in_stack_ffffffffffffffa8;
  MemorySSATransformation *in_stack_ffffffffffffffb0;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  MemorySSATransformation *this_02;
  
  uVar1 = 0;
  this_01 = in_RDI;
  this_02 = in_RDI;
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::vector
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)0x173cae);
  __first._M_current =
       (RWNode **)
       ElemWithEdges<dg::dda::RWBBlock>::getSinglePredecessor
                 ((ElemWithEdges<dg::dda::RWBBlock> *)this_01);
  if ((RWBBlock *)__first._M_current == (RWBBlock *)0x0) {
    findDefinitionsInMultiplePredecessors
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
  }
  else {
    findDefinitions(this_02,in_RSI,in_RDX);
    std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
              ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)in_RDI);
    __gnu_cxx::
    __normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
    ::__normal_iterator<dg::dda::RWNode**>
              ((__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                *)this_01,
               (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                *)in_RDI);
    std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
              ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)in_RDI);
    std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
              ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)in_RDI);
    __position._M_current._7_1_ = uVar1;
    __position._M_current._0_7_ = in_stack_ffffffffffffffd8;
    this_00 = std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
              insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>,void>
                        (in_stack_ffffffffffffffc0,__position,__first,in_stack_ffffffffffffffc8);
    std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~vector
              ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)this_00._M_current);
  }
  return (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)this_01;
}

Assistant:

std::vector<RWNode *>
MemorySSATransformation::findDefinitionsInPredecessors(RWBBlock *block,
                                                       const DefSite &ds) {
    assert(block);
    assert(ds.target && "Target is null");
    assert(!ds.target->isUnknown() &&
           "Finding uknown memory"); // this is handled differently

    std::vector<RWNode *> defs;

    // if we have a unique predecessor,
    // we can find the definitions there and continue searching in the
    // predecessor if something is missing
    if (auto *pred = block->getSinglePredecessor()) {
        auto pdefs = findDefinitions(pred, ds);
#ifndef NDEBUG
        auto &D = getBBlockDefinitions(pred, &ds);
        assert((!pdefs.empty() || D.unknownWrites.empty()) &&
               "BUG: if we found no definitions, also unknown writes must be "
               "empty");
#endif // not NDEBUG
        defs.insert(defs.end(), pdefs.begin(), pdefs.end());
    } else { // multiple or no predecessors
        findDefinitionsInMultiplePredecessors(block, ds, defs);
    }

    return defs;
}